

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O0

void Aig_ManRegPartitionAdd(Aig_ManPre_t *p,int iReg)

{
  Vec_Flt_t *p_00;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_01;
  int local_2c;
  int i;
  int iVar;
  int RetValue;
  Vec_Int_t *vSupp;
  int iReg_local;
  Aig_ManPre_t *p_local;
  
  if (p->pfUsedRegs[iReg] == '\0') {
    p->pfUsedRegs[iReg] = '\x01';
    Vec_IntPush(p->vUniques,iReg);
  }
  iVar1 = Vec_IntSize(p->vFreeVars);
  if (iVar1 < 1) {
    if (p->pfPartVars[iReg] != '\0') {
      __assert_fail("!p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                    ,0xdb,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
  }
  else {
    if (p->pfPartVars[iReg] == '\0') {
      __assert_fail("p->pfPartVars[iReg]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                    ,0xd6,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
    iVar1 = Vec_IntRemove(p->vFreeVars,iReg);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPartReg.c"
                    ,0xd8,"void Aig_ManRegPartitionAdd(Aig_ManPre_t *, int)");
    }
  }
  p->pfPartVars[iReg] = '\x01';
  Vec_IntPush(p->vRegs,iReg);
  p_01 = (Vec_Int_t *)Vec_PtrEntry(p->vMatrix,iReg);
  for (local_2c = 0; iVar1 = Vec_IntSize(p_01), local_2c < iVar1; local_2c = local_2c + 1) {
    iVar1 = Vec_IntEntry(p_01,local_2c);
    if (p->pfPartVars[iVar1] == '\0') {
      p->pfPartVars[iVar1] = '\x01';
      Vec_IntPush(p->vFreeVars,iVar1);
    }
  }
  p_00 = p->vPartCost;
  iVar1 = Vec_IntSize(p->vFreeVars);
  iVar2 = Vec_IntSize(p->vRegs);
  Vec_FltPush(p_00,((float)iVar1 * 1.0) / (float)iVar2);
  return;
}

Assistant:

void Aig_ManRegPartitionAdd( Aig_ManPre_t * p, int iReg )
{
    Vec_Int_t * vSupp;
    int RetValue, iVar, i;
    // make sure this is a new variable
//    assert( !p->pfUsedRegs[iReg] );
    if ( !p->pfUsedRegs[iReg] )
    {
        p->pfUsedRegs[iReg] = 1;
        Vec_IntPush( p->vUniques, iReg );
    }
    // remove it from the free variables
    if ( Vec_IntSize(p->vFreeVars) > 0 )
    {
        assert( p->pfPartVars[iReg] );
        RetValue = Vec_IntRemove( p->vFreeVars, iReg );
        assert( RetValue );
    }
    else
        assert( !p->pfPartVars[iReg] );
    // add it to the partition
    p->pfPartVars[iReg] = 1;
    Vec_IntPush( p->vRegs, iReg );
    // add new variables
    vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iReg );
    Vec_IntForEachEntry( vSupp, iVar, i )
    {
        if ( p->pfPartVars[iVar] )
            continue;
        p->pfPartVars[iVar] = 1;
        Vec_IntPush( p->vFreeVars, iVar );
    }
    // add it to the cost
    Vec_FltPush( p->vPartCost, 1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs) );
}